

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConstraintStamp.cpp
# Opt level: O3

void __thiscall OpenMD::ConstraintStamp::ConstraintStamp(ConstraintStamp *this)

{
  _Rb_tree_header *p_Var1;
  string *psVar2;
  ParamMap *this_00;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*>
  local_98;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_70;
  size_type local_68;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_60;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_50;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_48;
  ParameterBase *local_40;
  string *local_38;
  
  p_Var1 = &(this->super_DataHolder).parameters_._M_t._M_impl.super__Rb_tree_header;
  (this->super_DataHolder).parameters_._M_t._M_impl.super__Rb_tree_header._M_header._M_color =
       _S_red;
  (this->super_DataHolder).parameters_._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  (this->super_DataHolder).parameters_._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->super_DataHolder).parameters_._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->super_DataHolder).parameters_._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->super_DataHolder).deprecatedKeywords_._M_t._M_impl.super__Rb_tree_header;
  (this->super_DataHolder).deprecatedKeywords_._M_t._M_impl.super__Rb_tree_header._M_header._M_color
       = _S_red;
  (this->super_DataHolder).deprecatedKeywords_._M_t._M_impl.super__Rb_tree_header._M_header.
  _M_parent = (_Base_ptr)0x0;
  (this->super_DataHolder).deprecatedKeywords_._M_t._M_impl.super__Rb_tree_header._M_header._M_left
       = &p_Var1->_M_header;
  (this->super_DataHolder).deprecatedKeywords_._M_t._M_impl.super__Rb_tree_header._M_header._M_right
       = &p_Var1->_M_header;
  (this->super_DataHolder).deprecatedKeywords_._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->super_DataHolder)._vptr_DataHolder = (_func_int **)&PTR__ConstraintStamp_00243d68;
  local_40 = &(this->ConstrainedDistance).super_ParameterBase;
  psVar2 = &(this->ConstrainedDistance).super_ParameterBase.keyword_;
  local_48 = &(this->ConstrainedDistance).super_ParameterBase.keyword_.field_2;
  (this->ConstrainedDistance).super_ParameterBase.keyword_._M_dataplus._M_p = (pointer)local_48;
  (this->ConstrainedDistance).super_ParameterBase.keyword_._M_string_length = 0;
  (this->ConstrainedDistance).super_ParameterBase.keyword_.field_2._M_local_buf[0] = '\0';
  (this->ConstrainedDistance).super_ParameterBase.optional_ = false;
  (this->ConstrainedDistance).super_ParameterBase.defaultValue_ = false;
  (this->ConstrainedDistance).super_ParameterBase.empty_ = true;
  (this->ConstrainedDistance).super_ParameterBase._vptr_ParameterBase =
       (_func_int **)&PTR__ParameterBase_00242708;
  local_50 = &(this->PrintConstraintForce).super_ParameterBase.keyword_.field_2;
  (this->PrintConstraintForce).super_ParameterBase.keyword_._M_dataplus._M_p = (pointer)local_50;
  (this->PrintConstraintForce).super_ParameterBase.keyword_._M_string_length = 0;
  (this->PrintConstraintForce).super_ParameterBase.keyword_.field_2._M_local_buf[0] = '\0';
  (this->PrintConstraintForce).super_ParameterBase.optional_ = false;
  (this->PrintConstraintForce).super_ParameterBase.defaultValue_ = false;
  (this->PrintConstraintForce).super_ParameterBase.empty_ = true;
  (this->PrintConstraintForce).super_ParameterBase._vptr_ParameterBase =
       (_func_int **)&PTR__ParameterBase_00242690;
  paVar3 = &local_98.first.field_2;
  local_98.first._M_dataplus._M_p = (pointer)paVar3;
  local_38 = psVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_98,"constrainedDistance","");
  std::__cxx11::string::_M_assign((string *)psVar2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98.first._M_dataplus._M_p != paVar3) {
    operator_delete(local_98.first._M_dataplus._M_p,local_98.first.field_2._M_allocated_capacity + 1
                   );
  }
  local_70 = &local_60;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"constrainedDistance","");
  this_00 = &(this->super_DataHolder).parameters_;
  if (local_70 == &local_60) {
    local_98.first.field_2._8_8_ = local_60._8_8_;
    local_98.first._M_dataplus._M_p = (pointer)paVar3;
  }
  else {
    local_98.first._M_dataplus._M_p = (pointer)local_70;
  }
  local_98.first.field_2._M_allocated_capacity._1_7_ = local_60._M_allocated_capacity._1_7_;
  local_98.first.field_2._M_local_buf[0] = local_60._M_local_buf[0];
  local_98.first._M_string_length = local_68;
  local_68 = 0;
  local_60._M_local_buf[0] = '\0';
  local_98.second = local_40;
  local_70 = &local_60;
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
  ::_M_insert_unique<std::pair<std::__cxx11::string_const,ParameterBase*>>
            ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
              *)this_00,&local_98);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98.first._M_dataplus._M_p != paVar3) {
    operator_delete(local_98.first._M_dataplus._M_p,local_98.first.field_2._M_allocated_capacity + 1
                   );
  }
  if (local_70 != &local_60) {
    operator_delete(local_70,CONCAT71(local_60._M_allocated_capacity._1_7_,local_60._M_local_buf[0])
                             + 1);
  }
  local_98.first._M_dataplus._M_p = (pointer)paVar3;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_98,"printConstraintForce","");
  std::__cxx11::string::_M_assign
            ((string *)&(this->PrintConstraintForce).super_ParameterBase.keyword_);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98.first._M_dataplus._M_p != paVar3) {
    operator_delete(local_98.first._M_dataplus._M_p,local_98.first.field_2._M_allocated_capacity + 1
                   );
  }
  (this->PrintConstraintForce).super_ParameterBase.optional_ = true;
  (this->PrintConstraintForce).super_ParameterBase.defaultValue_ = true;
  (this->PrintConstraintForce).super_ParameterBase.empty_ = false;
  (this->PrintConstraintForce).super_ParameterBase.field_0x2b = 0;
  local_70 = &local_60;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"printConstraintForce","");
  if (local_70 == &local_60) {
    local_98.first.field_2._8_8_ = local_60._8_8_;
    local_98.first._M_dataplus._M_p = (pointer)paVar3;
  }
  else {
    local_98.first._M_dataplus._M_p = (pointer)local_70;
  }
  local_98.first.field_2._M_allocated_capacity._1_7_ = local_60._M_allocated_capacity._1_7_;
  local_98.first.field_2._M_local_buf[0] = local_60._M_local_buf[0];
  local_98.first._M_string_length = local_68;
  local_68 = 0;
  local_60._M_local_buf[0] = '\0';
  local_98.second = &(this->PrintConstraintForce).super_ParameterBase;
  local_70 = &local_60;
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
  ::_M_insert_unique<std::pair<std::__cxx11::string_const,ParameterBase*>>
            ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
              *)this_00,&local_98);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98.first._M_dataplus._M_p != paVar3) {
    operator_delete(local_98.first._M_dataplus._M_p,local_98.first.field_2._M_allocated_capacity + 1
                   );
  }
  if (local_70 != &local_60) {
    operator_delete(local_70,CONCAT71(local_60._M_allocated_capacity._1_7_,local_60._M_local_buf[0])
                             + 1);
  }
  return;
}

Assistant:

ConstraintStamp::ConstraintStamp() {
    DefineParameter(ConstrainedDistance, "constrainedDistance");
    DefineOptionalParameterWithDefaultValue(PrintConstraintForce,
                                            "printConstraintForce", false);
  }